

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

bool __thiscall tlx::CmdlineParser::ArgumentInt::process(ArgumentInt *this,int *argc,char ***argv)

{
  int iVar1;
  long lVar2;
  long x;
  char *endptr;
  char ***argv_local;
  int *argc_local;
  ArgumentInt *this_local;
  
  if ((((*argc != 0) &&
       (endptr = (char *)argv, argv_local = (char ***)argc, argc_local = (int *)this,
       lVar2 = strtol(**argv,(char **)&x,10), x != 0)) && (*(char *)x == '\0')) &&
     (iVar1 = std::numeric_limits<int>::max(), lVar2 <= iVar1)) {
    *(int *)argv_local = *(int *)argv_local + -1;
    *(long *)endptr = *(long *)endptr + 8;
    *this->dest_ = (int)lVar2;
    return true;
  }
  return false;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        char* endptr;
        long x = strtol(argv[0], &endptr, 10);
        if (endptr != nullptr && *endptr == 0 &&
            x <= std::numeric_limits<int>::max()) {
            --argc, ++argv;
            dest_ = static_cast<int>(x);
            return true;
        }
        else {
            return false;
        }
    }